

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdEmuD3D56TexFormat::emulate_mthd(MthdEmuD3D56TexFormat *this)

{
  pgraph_state *state;
  byte *pbVar1;
  uint32_t uVar2;
  int iVar3;
  int i;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int cmd;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint32_t *puVar12;
  uint uVar13;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar4 = (this->super_SingleMthdTest).super_MthdTest.val;
  uVar7 = uVar4 >> 0x1c & 7;
  uVar8 = uVar4 >> 0x18 & 7;
  uVar10 = uVar4 & 0xf0fff002 | 0x2000000;
  if (uVar8 != 2) {
    uVar10 = uVar4;
  }
  uVar10 = uVar10 & 0xf7fff002;
  if (uVar8 == 1) {
    uVar10 = uVar4 & 0xfffff002;
  }
  uVar8 = uVar4 >> 0x18 & 7;
  if (uVar8 == 0) {
    uVar10 = (uVar10 & 0xf8fff002) +
             (uint)((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                    super_Test.chipset.chipset < 0x11) * 0x1000000 + 0x2000000;
  }
  uVar6 = (uVar10 & 0xf8ffffff) + 0x3000000;
  if (uVar8 != 4) {
    uVar6 = uVar10;
  }
  uVar10 = (uint)(0x10 < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                         super_RepeatTest.super_Test.chipset.chipset) << 0x18 | uVar10 & 0xf8ffffff;
  if (uVar8 != 5) {
    uVar10 = uVar6;
  }
  uVar6 = uVar10 & 0xf8ffffff;
  if (uVar8 < 6) {
    uVar6 = uVar10;
  }
  uVar10 = uVar6 & 0x7fffffff;
  if (uVar7 == 1) {
    uVar10 = uVar6;
  }
  if (uVar7 == 0) {
    uVar10 = uVar10 & 0x8fffffff |
             (uint)((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                    super_Test.chipset.chipset < 0x11) << 0x1d;
  }
  uVar6 = uVar4 >> 0xc & 0xf;
  uVar9 = uVar4 >> 0x10 & 0xf;
  uVar8 = uVar4 >> 0x14 & 0xf;
  uVar13 = uVar10 & 0x8fffffff;
  if (uVar7 == 7) {
    uVar10 = uVar13;
  }
  uVar11 = uVar13 + 0x30000000;
  if (uVar7 != 4) {
    uVar11 = uVar10;
  }
  uVar10 = uVar13 | 0x10000000;
  if (uVar7 != 5) {
    uVar10 = uVar11;
  }
  if (uVar7 == 6) {
    uVar10 = (uint)(0x10 < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.
                           super_RepeatTest.super_Test.chipset.chipset) << 0x1d |
             uVar10 & 0x8fffffff;
  }
  if (uVar8 < uVar6 && uVar9 < uVar6) {
    if (uVar8 < uVar9) {
      uVar8 = uVar9;
    }
    uVar6 = uVar8 + 1 & 0xf;
  }
  uVar7 = uVar4 >> 8 & 0xf;
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
  if (uVar2 == 0x54) {
    if (uVar7 != 1) goto LAB_002162eb;
  }
  else if (uVar7 != 1 || uVar2 != 0x94) goto LAB_002162eb;
  uVar7 = 0;
LAB_002162eb:
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    lVar5 = 0;
    do {
      if (((uint)this->which >> ((uint)lVar5 & 0x1f) & 1) != 0) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[lVar5] =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format
             [lVar5] & 8 | uVar6 << 0xc | uVar7 << 7 | uVar4 >> 1 & 0x50 | uVar10 & 0xffff002f;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.cls;
    if ((uVar2 == 0x54) || (uVar2 == 0x94)) {
      uVar4 = (this->super_SingleMthdTest).super_MthdTest.val >> 2 & 3;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[0] =
           uVar4 + 0x4003ffc0;
      puVar12 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a
                + 1;
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_control_a[1] =
           uVar4 | 0x3ffc0;
      uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_format[0];
      uVar7 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b & 0x40
      ;
      uVar4 = ~uVar10 >> 0x1d & 0xfffffffc;
      if ((uVar10 >> 0x1b & 1) != 0) {
        uVar4 = 0;
      }
      if (uVar7 == 0) {
        uVar4 = uVar7 >> 6;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
           uVar4 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b
                   & 0xfffefffb;
      pgraph_celsius_icmd(state,4,uVar2,false);
      pgraph_celsius_icmd(state,6,(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                                  bundle_tex_control_a[0],false);
      cmd = 7;
    }
    else {
      iVar3 = this->which;
      if ((long)iVar3 == 2) {
        uVar7 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
                0x40;
        uVar4 = 0;
        if ((uVar10 >> 0x1b & 1) == 0) {
          uVar4 = ~uVar10 >> 0xf & 0x10000;
        }
        if (uVar7 == 0) {
          uVar4 = uVar7 >> 6;
        }
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
             uVar4 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                     celsius_xf_misc_b & 0xfffeffff;
      }
      cmd = iVar3 + 3;
      puVar12 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter +
                (long)iVar3 + 0xf;
    }
    pgraph_celsius_icmd(state,cmd,*puVar12,true);
    if ((this->which & 1) != 0) {
      uVar7 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b & 0x40
      ;
      uVar4 = 0;
      if ((uVar10 >> 0x1b & 1) == 0) {
        uVar4 = ~uVar10 >> 0x1d & 0xfffffffc;
      }
      if (uVar7 == 0) {
        uVar4 = uVar7 >> 6;
      }
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b =
           uVar4 | (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b
                   & 0xfffffffb;
    }
    uVar4 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a |
            0x10000000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_a = uVar4;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[2] = uVar4;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_pipe_junk[3] =
         (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_xf_misc_b;
  }
  uVar4 = this->which;
  if ((uVar4 & 1) != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     5);
    *pbVar1 = *pbVar1 | 0x80;
  }
  if ((uVar4 & 2) != 0) {
    pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid +
                     6);
    *pbVar1 = *pbVar1 | 0x20;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t rval = val & 0xfffff002;
		int omips = extr(val, 12, 4);
		int sfmt = extr(val, 8, 4);
		int fmt = sfmt;
		int mips = omips;
		int su = extr(val, 16, 4);
		int sv = extr(val, 20, 4);
		int wrapu = extr(val, 24, 3);
		int wrapv = extr(val, 28, 3);
		if (wrapu == 2)
			insrt(rval, 24, 4, 2);
		if (wrapu != 1)
			insrt(rval, 27, 1, 0);
		if (wrapu == 0)
			insrt(rval, 24, 3, nv04_pgraph_is_nv15p(&chipset) ? 2 : 3);
		if (wrapu == 4)
			insrt(rval, 24, 3, 3);
		if (wrapu == 5)
			insrt(rval, 24, 3, nv04_pgraph_is_nv15p(&chipset) ? 1 : 0);
		if (wrapu > 5)
			insrt(rval, 24, 3, 0);
		if (wrapv != 1)
			insrt(rval, 31, 1, 0);
		if (wrapv == 0)
			insrt(rval, 28, 3, nv04_pgraph_is_nv15p(&chipset) ? 0 : 2);
		if (wrapv == 7)
			insrt(rval, 28, 3, 0);
		if (wrapv == 4)
			insrt(rval, 28, 3, 3);
		if (wrapv == 5)
			insrt(rval, 28, 3, 1);
		if (wrapv == 6)
			insrt(rval, 28, 3, nv04_pgraph_is_nv15p(&chipset) ? 2 : 0);
		if (mips > su && mips > sv)
			mips = (su > sv ? su : sv) + 1;
		if (cls == 0x54 || cls == 0x94) {
			if (sfmt == 1)
				fmt = 0;
		}
		insrt(rval, 4, 1, extr(val, 5, 1));
		insrt(rval, 6, 1, extr(val, 7, 1));
		insrt(rval, 7, 5, fmt);
		insrt(rval, 12, 4, mips);
		if (!extr(exp.nsource, 1, 1)) {
			for (int i = 0; i < 2; i++) {
				if (which & 1 << i) {
					exp.bundle_tex_format[i] = rval | (exp.bundle_tex_format[i] & 8);
				}
			}
			if (cls == 0x94 || cls == 0x54) {
				exp.bundle_tex_control_a[0] = 0x4003ffc0 | extr(val, 2, 2);
				exp.bundle_tex_control_a[1] = 0x3ffc0 | extr(val, 2, 2);
				insrt(exp.celsius_xf_misc_b, 2, 1,
					extr(exp.bundle_config_b, 6, 1) &&
					!extr(rval, 27, 1) && !extr(rval, 31, 1));
				insrt(exp.celsius_xf_misc_b, 16, 1, 0);
				pgraph_celsius_icmd(&exp, 4, exp.bundle_tex_format[0], false);
				pgraph_celsius_icmd(&exp, 6, exp.bundle_tex_control_a[0], false);
				pgraph_celsius_icmd(&exp, 7, exp.bundle_tex_control_a[1], true);
			} else {
				if (which == 2) {
					insrt(exp.celsius_xf_misc_b, 16, 1,
						extr(exp.bundle_config_b, 6, 1) &&
						!extr(rval, 27, 1) && !extr(rval, 31, 1));
				}
				pgraph_celsius_icmd(&exp, 4 + which - 1, exp.bundle_tex_format[which - 1], true);
			}
			if (which & 1) {
				insrt(exp.celsius_xf_misc_b, 2, 1,
					extr(exp.bundle_config_b, 6, 1) &&
					!extr(rval, 27, 1) && !extr(rval, 31, 1));
			}
			insrt(exp.celsius_xf_misc_a, 28, 1, 1);
			exp.celsius_pipe_junk[2] = exp.celsius_xf_misc_a;
			exp.celsius_pipe_junk[3] = exp.celsius_xf_misc_b;
		}
		if (which & 1)
			insrt(exp.valid[1], 15, 1, 1);
		if (which & 2)
			insrt(exp.valid[1], 21, 1, 1);
	}